

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O0

istream * spvtools::utils::operator>>
                    (istream *is,
                    HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
                    *value)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  fmtflags __a;
  _Ios_Fmtflags _Var4;
  int iVar5;
  unsigned_long uVar6;
  long lVar7;
  bool bVar8;
  bool local_e1;
  byte local_d2;
  byte local_d1;
  FloatProxy<double> local_c0;
  FloatProxy<double> output_float;
  uint_type shifted_exponent;
  uint_type output_bits;
  int_type max_exponent;
  bool is_zero;
  int_type digit;
  int_type written_exponent_overflow;
  int_type written_exponent;
  bool seen_written_exponent_digits;
  int8_t exponent_sign;
  bool seen_exponent_sign;
  uint_type write_bit_1;
  int i_1;
  int number_1;
  uint_type write_bit;
  int i;
  int number;
  bool bits_written;
  bool has_integer_part;
  int_type exponent;
  uint_type fraction_index;
  uint_type fraction;
  bool seen_dot;
  bool seen_p;
  int_type maybe_hex_start;
  bool negate_value;
  FloatProxy<double> FStack_28;
  int_type next_char;
  HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
  *local_20;
  HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
  *value_local;
  istream *is_local;
  
  local_20 = value;
  value_local = (HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
                 *)is;
  FloatProxy<double>::FloatProxy(&stack0xffffffffffffffd8,0.0);
  HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
  ::set_value(value,FStack_28);
  __a = std::ios_base::flags
                  ((ios_base *)
                   ((long)&(value_local->value_).data_ +
                   *(long *)((value_local->value_).data_ - 0x18)));
  _Var4 = std::operator&(__a,_S_skipws);
  if (_Var4 != ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max)) {
    while( true ) {
      iVar5 = std::istream::peek();
      iVar5 = isspace(iVar5);
      if (iVar5 == 0) break;
      std::istream::get();
    }
  }
  maybe_hex_start = std::istream::peek();
  seen_p = false;
  if ((maybe_hex_start == 0x2d) || (maybe_hex_start == 0x30)) {
    if (maybe_hex_start == 0x2d) {
      seen_p = true;
      std::istream::get();
      maybe_hex_start = std::istream::peek();
    }
    if (maybe_hex_start == 0x30) {
      std::istream::get();
      fraction._4_4_ = std::istream::peek();
      if ((fraction._4_4_ == 0x78) || (fraction._4_4_ == 0x58)) {
        std::istream::get();
        fraction._3_1_ = 0;
        fraction._2_1_ = 0;
        fraction_index = 0;
        exponent = 0;
        _number = 0x3ff;
        while (maybe_hex_start = std::istream::peek(), maybe_hex_start == 0x30) {
          std::istream::get();
        }
        bVar1 = false;
        bVar8 = false;
        while( true ) {
          local_d1 = 0;
          if ((fraction._3_1_ & 1) == 0) {
            local_d1 = fraction._2_1_ ^ 0xff;
          }
          if ((local_d1 & 1) == 0) break;
          if (maybe_hex_start == 0x2e) {
            fraction._2_1_ = 1;
          }
          else if (maybe_hex_start == 0x70) {
            fraction._3_1_ = 1;
          }
          else {
            iVar5 = isxdigit(maybe_hex_start);
            if (iVar5 == 0) {
              std::ios::setstate((int)value_local +
                                 (int)*(undefined8 *)((value_local->value_).data_ - 0x18));
              return (istream *)value_local;
            }
            bVar1 = true;
            bVar2 = get_nibble_from_character(maybe_hex_start);
            for (write_bit._4_4_ = 0; write_bit._4_4_ < 4; write_bit._4_4_ = write_bit._4_4_ + 1) {
              uVar6 = (unsigned_long)(int)(uint)((bVar2 & 8) != 0);
              if (bVar8) {
                fraction_index =
                     detail::set_nth_most_significant_bit<unsigned_long>
                               (fraction_index,uVar6,exponent);
                detail::saturated_inc<unsigned_long>((unsigned_long *)&exponent);
                bVar3 = detail::saturated_inc<long>((long *)&number);
                if (!bVar3) {
                  std::ios::setstate((int)value_local +
                                     (int)*(undefined8 *)((value_local->value_).data_ - 0x18));
                  return (istream *)value_local;
                }
              }
              bVar8 = bVar8 || uVar6 != 0;
              bVar2 = bVar2 << 1;
            }
          }
          std::istream::get();
          maybe_hex_start = std::istream::peek();
        }
        bVar8 = false;
        while( true ) {
          local_d2 = 0;
          if ((fraction._2_1_ & 1) != 0) {
            local_d2 = fraction._3_1_ ^ 0xff;
          }
          if ((local_d2 & 1) == 0) break;
          if (maybe_hex_start == 0x70) {
            fraction._3_1_ = 1;
          }
          else {
            iVar5 = isxdigit(maybe_hex_start);
            if (iVar5 == 0) {
              std::ios::setstate((int)value_local +
                                 (int)*(undefined8 *)((value_local->value_).data_ - 0x18));
              return (istream *)value_local;
            }
            bVar2 = get_nibble_from_character(maybe_hex_start);
            for (write_bit_1._0_4_ = 0; (int)write_bit_1 < 4;
                write_bit_1._0_4_ = (int)write_bit_1 + 1) {
              uVar6 = (unsigned_long)(int)(uint)((bVar2 & 8) != 0);
              bVar8 = bVar8 || uVar6 != 0;
              if ((bVar1) || (bVar8)) {
                fraction_index =
                     detail::set_nth_most_significant_bit<unsigned_long>
                               (fraction_index,uVar6,exponent);
                detail::saturated_inc<unsigned_long>((unsigned_long *)&exponent);
              }
              else {
                bVar3 = detail::saturated_dec<long>((long *)&number);
                if (!bVar3) {
                  std::ios::setstate((int)value_local +
                                     (int)*(undefined8 *)((value_local->value_).data_ - 0x18));
                  return (istream *)value_local;
                }
              }
              bVar2 = bVar2 << 1;
            }
          }
          std::istream::get();
          maybe_hex_start = std::istream::peek();
        }
        bVar3 = false;
        written_exponent._6_1_ = '\x01';
        bVar8 = false;
        written_exponent_overflow = 0;
        do {
          if ((bVar8) || ((maybe_hex_start != 0x2d && (maybe_hex_start != 0x2b)))) {
            iVar5 = isdigit(maybe_hex_start);
            if (iVar5 == 0) {
              if (!bVar8) {
                std::ios::setstate((int)value_local +
                                   (int)*(undefined8 *)((value_local->value_).data_ - 0x18));
                return (istream *)value_local;
              }
              lVar7 = written_exponent_overflow * written_exponent._6_1_;
              if ((lVar7 < 0) || ((long)_number < 0)) {
                if ((lVar7 < 0) && ((long)_number < 0)) {
                  if (-lVar7 < (long)(_number + 0x7ffffffffffffffe)) {
                    _number = lVar7 + _number;
                  }
                  else {
                    _number = 0x8000000000000002;
                  }
                }
                else {
                  _number = lVar7 + _number;
                }
              }
              else if (lVar7 < (long)(0x7ffffffffffffffe - _number)) {
                _number = lVar7 + _number;
              }
              else {
                _number = 0x7ffffffffffffffe;
              }
              bVar8 = !bVar1;
              bVar3 = fraction_index == 0;
              local_e1 = bVar8 && bVar3;
              if ((bVar1) || (local_e1)) {
                if (bVar8 && bVar3) {
                  _number = 0;
                }
              }
              else {
                fraction_index = fraction_index << 1;
                _number = _number - 1;
              }
              if (((long)_number < 1) && (!bVar8 || !bVar3)) {
                fraction_index = fraction_index >> 1 | 0x8000000000000000;
              }
              fraction_index = fraction_index >> 0xc;
              while( true ) {
                bVar8 = false;
                if ((long)_number < 0) {
                  bVar8 = (bool)(local_e1 ^ 1);
                }
                if (!bVar8) break;
                fraction_index = fraction_index >> 1;
                _number = _number + 1;
                if (fraction_index == 0) {
                  local_e1 = true;
                  _number = 0;
                }
              }
              if (0x7ff < (long)_number) {
                _number = 0x7ff;
                fraction_index = 0;
              }
              output_float.data_ = (_number & 0x7ff) << 0x34;
              FloatProxy<double>::FloatProxy
                        (&local_c0,
                         output_float.data_ |
                         fraction_index | (long)(int)(uint)((seen_p & 1U) != 0) << 0x3f);
              HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
              ::set_value(local_20,local_c0);
              return (istream *)value_local;
            }
            bVar8 = true;
            if (written_exponent_overflow <
                (0x7ffffffffffffffe - ((long)maybe_hex_start + -0x30)) / 10) {
              written_exponent_overflow =
                   written_exponent_overflow * 10 + (long)maybe_hex_start + -0x30;
            }
            else {
              written_exponent_overflow = 0x7ffffffffffffffe;
            }
          }
          else {
            if (bVar3) {
              std::ios::setstate((int)value_local +
                                 (int)*(undefined8 *)((value_local->value_).data_ - 0x18));
              return (istream *)value_local;
            }
            bVar3 = true;
            written_exponent._6_1_ = '\x01';
            if (maybe_hex_start == 0x2d) {
              written_exponent._6_1_ = -1;
            }
          }
          std::istream::get();
          maybe_hex_start = std::istream::peek();
        } while( true );
      }
      std::istream::unget();
      is_local = ParseNormalFloat<spvtools::utils::FloatProxy<double>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>>>
                           ((istream *)value_local,(bool)(seen_p & 1),local_20);
    }
    else {
      is_local = ParseNormalFloat<spvtools::utils::FloatProxy<double>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>>>
                           ((istream *)value_local,(bool)(seen_p & 1),local_20);
    }
  }
  else {
    is_local = ParseNormalFloat<spvtools::utils::FloatProxy<double>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>>>
                         ((istream *)value_local,false,local_20);
  }
  return is_local;
}

Assistant:

std::istream& operator>>(std::istream& is, HexFloat<T, Traits>& value) {
  using HF = HexFloat<T, Traits>;
  using uint_type = typename HF::uint_type;
  using int_type = typename HF::int_type;

  value.set_value(static_cast<typename HF::native_type>(0.f));

  if (is.flags() & std::ios::skipws) {
    // If the user wants to skip whitespace , then we should obey that.
    while (std::isspace(is.peek())) {
      is.get();
    }
  }

  auto next_char = is.peek();
  bool negate_value = false;

  if (next_char != '-' && next_char != '0') {
    return ParseNormalFloat(is, negate_value, value);
  }

  if (next_char == '-') {
    negate_value = true;
    is.get();
    next_char = is.peek();
  }

  if (next_char == '0') {
    is.get();  // We may have to unget this.
    auto maybe_hex_start = is.peek();
    if (maybe_hex_start != 'x' && maybe_hex_start != 'X') {
      is.unget();
      return ParseNormalFloat(is, negate_value, value);
    } else {
      is.get();  // Throw away the 'x';
    }
  } else {
    return ParseNormalFloat(is, negate_value, value);
  }

  // This "looks" like a hex-float so treat it as one.
  bool seen_p = false;
  bool seen_dot = false;

  // The mantissa bits, without the most significant 1 bit, and with the
  // the most recently read bits in the least significant positions.
  uint_type fraction = 0;
  // The number of mantissa bits that have been read, including the leading 1
  // bit that is not written into 'fraction'.
  uint_type fraction_index = 0;

  // TODO(dneto): handle overflow and underflow
  int_type exponent = HF::exponent_bias;

  // Strip off leading zeros so we don't have to special-case them later.
  while ((next_char = is.peek()) == '0') {
    is.get();
  }

  // Does the mantissa, as written, have non-zero digits to the left of
  // the decimal point.  Assume no until proven otherwise.
  bool has_integer_part = false;
  bool bits_written = false;  // Stays false until we write a bit.

  // Scan the mantissa hex digits until we see a '.' or the 'p' that
  // starts the exponent.
  while (!seen_p && !seen_dot) {
    // Handle characters that are left of the fractional part.
    if (next_char == '.') {
      seen_dot = true;
    } else if (next_char == 'p') {
      seen_p = true;
    } else if (::isxdigit(next_char)) {
      // We have stripped all leading zeroes and we have not yet seen a ".".
      has_integer_part = true;
      int number = get_nibble_from_character(next_char);
      for (int i = 0; i < 4; ++i, number <<= 1) {
        uint_type write_bit = (number & 0x8) ? 0x1 : 0x0;
        if (bits_written) {
          // If we are here the bits represented belong in the fractional
          // part of the float, and we have to adjust the exponent accordingly.
          fraction = detail::set_nth_most_significant_bit(fraction, write_bit,
                                                          fraction_index);
          // Increment the fraction index. If the input has bizarrely many
          // significant digits, then silently drop them.
          detail::saturated_inc(fraction_index);
          if (!detail::saturated_inc(exponent)) {
            // Overflow failure
            is.setstate(std::ios::failbit);
            return is;
          }
        }
        // Since this updated after setting fraction bits, this effectively
        // drops the leading 1 bit.
        bits_written |= write_bit != 0;
      }
    } else {
      // We have not found our exponent yet, so we have to fail.
      is.setstate(std::ios::failbit);
      return is;
    }
    is.get();
    next_char = is.peek();
  }

  // Finished reading the part preceding any '.' or 'p'.

  bits_written = false;
  while (seen_dot && !seen_p) {
    // Handle only fractional parts now.
    if (next_char == 'p') {
      seen_p = true;
    } else if (::isxdigit(next_char)) {
      int number = get_nibble_from_character(next_char);
      for (int i = 0; i < 4; ++i, number <<= 1) {
        uint_type write_bit = (number & 0x8) ? 0x01 : 0x00;
        bits_written |= write_bit != 0;
        if ((!has_integer_part) && !bits_written) {
          // Handle modifying the exponent here this way we can handle
          // an arbitrary number of hex values without overflowing our
          // integer.
          if (!detail::saturated_dec(exponent)) {
            // Overflow failure
            is.setstate(std::ios::failbit);
            return is;
          }
        } else {
          fraction = detail::set_nth_most_significant_bit(fraction, write_bit,
                                                          fraction_index);
          // Increment the fraction index. If the input has bizarrely many
          // significant digits, then silently drop them.
          detail::saturated_inc(fraction_index);
        }
      }
    } else {
      // We still have not found our 'p' exponent yet, so this is not a valid
      // hex-float.
      is.setstate(std::ios::failbit);
      return is;
    }
    is.get();
    next_char = is.peek();
  }

  // Finished reading the part preceding 'p'.
  // In hex floats syntax, the binary exponent is required.

  bool seen_exponent_sign = false;
  int8_t exponent_sign = 1;
  bool seen_written_exponent_digits = false;
  // The magnitude of the exponent, as written, or the sentinel value to signal
  // overflow.
  int_type written_exponent = 0;
  // A sentinel value signalling overflow of the magnitude of the written
  // exponent.  We'll assume that -written_exponent_overflow is valid for the
  // type. Later we may add 1 or subtract 1 from the adjusted exponent, so leave
  // room for an extra 1.
  const int_type written_exponent_overflow =
      std::numeric_limits<int_type>::max() - 1;
  while (true) {
    if (!seen_written_exponent_digits &&
        (next_char == '-' || next_char == '+')) {
      if (seen_exponent_sign) {
        is.setstate(std::ios::failbit);
        return is;
      }
      seen_exponent_sign = true;
      exponent_sign = (next_char == '-') ? -1 : 1;
    } else if (::isdigit(next_char)) {
      seen_written_exponent_digits = true;
      // Hex-floats express their exponent as decimal.
      int_type digit =
          static_cast<int_type>(static_cast<int_type>(next_char) - '0');
      if (written_exponent >= (written_exponent_overflow - digit) / 10) {
        // The exponent is very big. Saturate rather than overflow the exponent.
        // signed integer, which would be undefined behaviour.
        written_exponent = written_exponent_overflow;
      } else {
        written_exponent = static_cast<int_type>(
            static_cast<int_type>(written_exponent * 10) + digit);
      }
    } else {
      break;
    }
    is.get();
    next_char = is.peek();
  }
  if (!seen_written_exponent_digits) {
    // Binary exponent had no digits.
    is.setstate(std::ios::failbit);
    return is;
  }

  written_exponent = static_cast<int_type>(written_exponent * exponent_sign);
  // Now fold in the exponent bias into the written exponent, updating exponent.
  // But avoid undefined behaviour that would result from overflowing int_type.
  if (written_exponent >= 0 && exponent >= 0) {
    // Saturate up to written_exponent_overflow.
    if (written_exponent_overflow - exponent > written_exponent) {
      exponent = static_cast<int_type>(written_exponent + exponent);
    } else {
      exponent = written_exponent_overflow;
    }
  } else if (written_exponent < 0 && exponent < 0) {
    // Saturate down to -written_exponent_overflow.
    if (written_exponent_overflow + exponent > -written_exponent) {
      exponent = static_cast<int_type>(written_exponent + exponent);
    } else {
      exponent = static_cast<int_type>(-written_exponent_overflow);
    }
  } else {
    // They're of opposing sign, so it's safe to add.
    exponent = static_cast<int_type>(written_exponent + exponent);
  }

  bool is_zero = (!has_integer_part) && (fraction == 0);
  if ((!has_integer_part) && !is_zero) {
    fraction = static_cast<uint_type>(fraction << 1);
    exponent = static_cast<int_type>(exponent - 1);
  } else if (is_zero) {
    exponent = 0;
  }

  if (exponent <= 0 && !is_zero) {
    fraction = static_cast<uint_type>(fraction >> 1);
    fraction |= static_cast<uint_type>(1) << HF::top_bit_left_shift;
  }

  fraction = (fraction >> HF::fraction_right_shift) & HF::fraction_encode_mask;

  const int_type max_exponent =
      SetBits<uint_type, 0, HF::num_exponent_bits>::get;

  // Handle denorm numbers
  while (exponent < 0 && !is_zero) {
    fraction = static_cast<uint_type>(fraction >> 1);
    exponent = static_cast<int_type>(exponent + 1);

    fraction &= HF::fraction_encode_mask;
    if (fraction == 0) {
      // We have underflowed our fraction. We should clamp to zero.
      is_zero = true;
      exponent = 0;
    }
  }

  // We have overflowed so we should be inf/-inf.
  if (exponent > max_exponent) {
    exponent = max_exponent;
    fraction = 0;
  }

  uint_type output_bits = static_cast<uint_type>(
      static_cast<uint_type>(negate_value ? 1 : 0) << HF::top_bit_left_shift);
  output_bits |= fraction;

  uint_type shifted_exponent = static_cast<uint_type>(
      static_cast<uint_type>(exponent << HF::exponent_left_shift) &
      HF::exponent_mask);
  output_bits |= shifted_exponent;

  T output_float(output_bits);
  value.set_value(output_float);

  return is;
}